

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O1

ParserResult *
parse_command_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  undefined1 auVar5 [8];
  undefined8 uVar6;
  bool bVar7;
  SyntaxTree *__p;
  ParserState positive_command;
  shared_ptr<SyntaxTree> local_1a8;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_198;
  long local_148;
  undefined1 local_138 [8];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  _Stack_130;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_d8;
  undefined8 local_88;
  ParserState local_80;
  
  if ((begin == end) || (begin->type != NOT)) {
    parse_positive_command_statement(__return_storage_ptr__,parser,begin,end);
  }
  else {
    local_d8._0_8_ = 0;
    local_d8._8_8_ = 0;
    local_88 = 1;
    local_198._64_8_ = 0;
    local_198._72_8_ = 0;
    local_198._48_8_ = 0;
    local_198._56_8_ = 0;
    local_198._32_8_ = 0;
    local_198._40_8_ = 0;
    local_198._16_8_ = 0;
    local_198._24_8_ = 0;
    local_198._0_8_ = (element_type *)0x0;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148 = 0;
    parse_positive_command_statement((ParserResult *)local_138,parser,begin + 1,end);
    auVar4 = local_138;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                 *)&local_198._tail,&_Stack_130);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy(&_Stack_130);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_80,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_198._tail);
    giveup_to_expected((ParserState *)local_138,&local_80,"command");
    add_error((ParserState *)&local_d8._tail,(ParserState *)local_138);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_138);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy(&local_80._storage);
    bVar7 = eggs::variants::detail::
            apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                      ((anon_class_1_0_00000001 *)local_138,
                       (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                        *)&local_d8._tail);
    if (bVar7) {
      __p = (SyntaxTree *)operator_new(0x88);
      (__p->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__p->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __p->type_ = NOT;
      uVar3 = *(undefined4 *)&begin->field_0x4;
      sVar2 = begin->begin;
      (__p->token).type = begin->type;
      *(undefined4 *)&(__p->token).field_0x4 = uVar3;
      (__p->token).begin = sVar2;
      (__p->token).end = begin->end;
      (__p->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (parser->instream).
             super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (parser->instream).
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (__p->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      (__p->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
      (__p->udata).vtable = (vtable_type *)0x0;
      (__p->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(__p->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(__p->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_138,__p);
      if (local_148 != 1) {
        eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
      }
      local_1a8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._0_8_;
      local_1a8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
        }
      }
      SyntaxTree::add_child((SyntaxTree *)local_138,&local_1a8);
      if (local_1a8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      uVar6 = _Stack_130.
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              .
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
              .
              super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
              .field_0._0_8_;
      auVar5 = local_138;
      local_138 = (undefined1  [8])0x0;
      _Stack_130.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0._0_8_ = 0;
      __return_storage_ptr__->first = (TokenData *)auVar4;
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->second)._storage.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0 = auVar5;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->second)._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0 + 8) = uVar6;
      (__return_storage_ptr__->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      ._which = 1;
    }
    else {
      __return_storage_ptr__->first = (TokenData *)auVar4;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&__return_storage_ptr__->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_d8._tail);
    }
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)&local_198._tail);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)&local_d8._tail);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_command_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end && begin->type == Token::NOT)
    {
        ParserState state = ParserSuccess(nullptr);
        ParserState positive_command;

        auto it = std::next(begin);

        std::tie(it, positive_command) = parse_positive_command_statement(parser, it, end);
        add_error(state, giveup_to_expected(positive_command, "command"));

        if(is<ParserSuccess>(state))
        {
            shared_ptr<SyntaxTree> tree(new SyntaxTree(NodeType::NOT, parser.instream, *begin));
            tree->add_child(get<ParserSuccess>(positive_command).tree);
            return std::make_pair(it, ParserSuccess(std::move(tree)));
        }
        else
        {
            return std::make_pair(it, std::move(state));
        }
    }
    else
    {
        return parse_positive_command_statement(parser, begin, end);
    }
}